

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

Object<cmCMakePresetsGraph::TestPreset::ExcludeOptions> * __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
Object<cmCMakePresetsGraph::TestPreset::ExcludeOptions>::
Bind<cmCMakePresetsGraph::TestPreset::ExcludeOptions,std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>,std::function<cmCMakePresetsGraph::ReadFileResult(std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>&,Json::Value_const*)>>
          (Object<cmCMakePresetsGraph::TestPreset::ExcludeOptions> *this,string_view *name,
          offset_in_ExcludeOptions_to_optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>
          member,function<cmCMakePresetsGraph::ReadFileResult_(std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>_&,_const_Json::Value_*)>
                 *func,bool required)

{
  Object<cmCMakePresetsGraph::TestPreset::ExcludeOptions> *pOVar1;
  anon_class_40_2_315d8239 local_78;
  MemberFunction local_50;
  byte local_29;
  function<cmCMakePresetsGraph::ReadFileResult_(std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>_&,_const_Json::Value_*)>
  *pfStack_28;
  bool required_local;
  function<cmCMakePresetsGraph::ReadFileResult_(std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>_&,_const_Json::Value_*)>
  *func_local;
  offset_in_ExcludeOptions_to_optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>
  member_local;
  string_view *name_local;
  Object<cmCMakePresetsGraph::TestPreset::ExcludeOptions> *this_local;
  
  local_29 = required;
  pfStack_28 = func;
  func_local = (function<cmCMakePresetsGraph::ReadFileResult_(std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>_&,_const_Json::Value_*)>
                *)member;
  member_local = (offset_in_ExcludeOptions_to_optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>
                  )name;
  name_local = (string_view *)this;
  std::
  function<cmCMakePresetsGraph::ReadFileResult_(std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>_&,_const_Json::Value_*)>
  ::function(&local_78.func,func);
  local_78.member =
       (offset_in_ExcludeOptions_to_optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>
        )func_local;
  std::
  function<cmCMakePresetsGraph::ReadFileResult(cmCMakePresetsGraph::TestPreset::ExcludeOptions&,Json::Value_const*)>
  ::
  function<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset::ExcludeOptions>::Bind<cmCMakePresetsGraph::TestPreset::ExcludeOptions,std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>,std::function<cmCMakePresetsGraph::ReadFileResult(std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>&,Json::Value_const*)>>(std::basic_string_view<char,std::char_traits<char>>const&,std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>cmCMakePresetsGraph::TestPreset::ExcludeOptions::*,std::function<cmCMakePresetsGraph::ReadFileResult(std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>&,Json::Value_const*)>,bool)::_lambda(cmCMakePresetsGraph::TestPreset::ExcludeOptions&,Json::Value_const*)_1_,void>
            ((function<cmCMakePresetsGraph::ReadFileResult(cmCMakePresetsGraph::TestPreset::ExcludeOptions&,Json::Value_const*)>
              *)&local_50,&local_78);
  pOVar1 = BindPrivate(this,name,&local_50,(bool)(local_29 & 1));
  std::
  function<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::TestPreset::ExcludeOptions_&,_const_Json::Value_*)>
  ::~function(&local_50);
  Bind<cmCMakePresetsGraph::TestPreset::ExcludeOptions,std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>,std::function<cmCMakePresetsGraph::ReadFileResult(std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>&,Json::Value_const*)>>(std::basic_string_view<char,std::char_traits<char>>const&,std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>cmCMakePresetsGraph::TestPreset::ExcludeOptions::*,std::function<cmCMakePresetsGraph::ReadFileResult(std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>&,Json::Value_const*)>,bool)
  ::{lambda(cmCMakePresetsGraph::TestPreset::ExcludeOptions&,Json::Value_const*)#1}::
  ~basic_string_view((_lambda_cmCMakePresetsGraph__TestPreset__ExcludeOptions__Json__Value_const___1_
                      *)&local_78);
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, M U::*member, F func,
                 bool required = true)
    {
      return this->BindPrivate(name,
                               [func, member](T& out, const Json::Value* value,
                                              CallState&&... state) -> E {
                                 return func(out.*member, value,
                                             std::forward(state)...);
                               },
                               required);
    }